

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

int connection_start_endpoint
              (ENDPOINT_HANDLE endpoint,ON_ENDPOINT_FRAME_RECEIVED on_endpoint_frame_received,
              ON_CONNECTION_STATE_CHANGED on_connection_state_changed,void *context)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if ((on_endpoint_frame_received == (ON_ENDPOINT_FRAME_RECEIVED)0x0 ||
      endpoint == (ENDPOINT_HANDLE)0x0) ||
      on_connection_state_changed == (ON_CONNECTION_STATE_CHANGED)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x79e;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_start_endpoint",0x79d,1,
                "Bad arguments: endpoint = %p, on_endpoint_frame_received = %p, on_connection_state_changed = %p"
                ,endpoint,on_endpoint_frame_received,on_connection_state_changed);
    }
  }
  else {
    endpoint->on_endpoint_frame_received = on_endpoint_frame_received;
    endpoint->on_connection_state_changed = on_connection_state_changed;
    endpoint->callback_context = context;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int connection_start_endpoint(ENDPOINT_HANDLE endpoint, ON_ENDPOINT_FRAME_RECEIVED on_endpoint_frame_received, ON_CONNECTION_STATE_CHANGED on_connection_state_changed, void* context)
{
    int result;

    if ((endpoint == NULL) ||
        (on_endpoint_frame_received == NULL) ||
        (on_connection_state_changed == NULL))
    {
        LogError("Bad arguments: endpoint = %p, on_endpoint_frame_received = %p, on_connection_state_changed = %p",
            endpoint, on_endpoint_frame_received, on_connection_state_changed);
        result = MU_FAILURE;
    }
    else
    {
        endpoint->on_endpoint_frame_received = on_endpoint_frame_received;
        endpoint->on_connection_state_changed = on_connection_state_changed;
        endpoint->callback_context = context;

        result = 0;
    }

    return result;
}